

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.hpp
# Opt level: O1

void __thiscall schema::ColumnBase::~ColumnBase(ColumnBase *this)

{
  ~ColumnBase(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ColumnBase() = default;